

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O0

void __thiscall
jsoncons::jsonschema::
const_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::const_validator(const_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *this,basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                        *schema,uri *schema_location,string *custom_message,
                 basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *sch)

{
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RDI;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffff88;
  string *custom_message_00;
  uri *in_stack_ffffffffffffffa0;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  void **in_stack_ffffffffffffffb8;
  allocator<char> *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  validator_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::validator_base((validator_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *)(in_RDI + 0xf));
  custom_message_00 = (string *)&stack0xffffffffffffffb7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::keyword_validator((keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                       *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                      in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                      custom_message_00);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  *(undefined8 *)&in_RDI->field_0 = 0x13432c0;
  *(undefined8 *)&in_RDI[0xf].field_0 = 0x1343348;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
            (in_RDI,in_stack_ffffffffffffff88);
  return;
}

Assistant:

const_validator(const Json& schema, const uri& schema_location, const std::string& custom_message, const Json& sch)
            : keyword_validator<Json>("const", schema, schema_location, custom_message), value_(sch)
        {
        }